

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_cache.hpp
# Opt level: O0

void __thiscall tcmalloc::ThreadCache::Init(ThreadCache *this)

{
  uint64_t size;
  int local_14;
  int cl;
  ThreadCache *this_local;
  
  this->total_alloc_ = 0;
  this->total_free_ = 0;
  this->prev = (ThreadCache *)0x0;
  this->next = (ThreadCache *)0x0;
  this->size_ = 0;
  this->max_size_ = 0;
  IncreaseCacheLimitLocked(this);
  for (local_14 = 0; local_14 < 0x56; local_14 = local_14 + 1) {
    size = ClassSize(local_14);
    ThreadCacheFreeList::Init(this->freelists_ + local_14,local_14,size);
  }
  return;
}

Assistant:

void Init() {
        total_alloc_ = 0;
        total_free_ = 0;
        prev = nullptr;
        next = nullptr;

        size_ = 0;
        max_size_ = 0;
        IncreaseCacheLimitLocked();
        if (max_size_ < 0) {
            max_size_ = kMinThreadCacheSize;
            unclaimed_cache_space -= kMinThreadCacheSize;
        }
        for (int cl = 0; cl < kMaxClass; ++cl) {
            freelists_[cl].Init(cl, ClassSize(cl));
        }
    }